

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ResolvedConfig * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ResolvedConfig,slang::ast::ConfigBlockSymbol_const&,slang::ast::InstanceSymbol&>
          (BumpAllocator *this,ConfigBlockSymbol *args,InstanceSymbol *args_1)

{
  ResolvedConfig *this_00;
  
  this_00 = (ResolvedConfig *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ResolvedConfig *)this->endPtr < this_00 + 1) {
    this_00 = (ResolvedConfig *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::ResolvedConfig::ResolvedConfig(this_00,args,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }